

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int fmt::getpagesize(void)

{
  long lVar1;
  SystemError *this;
  int *piVar2;
  
  lVar1 = sysconf(0x1e);
  if (-1 < lVar1) {
    return (int)lVar1;
  }
  this = (SystemError *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  SystemError::SystemError(this,*piVar2,(CStringRef)0x17832e);
  __cxa_throw(this,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

long fmt::getpagesize() {
#ifdef _WIN32
  SYSTEM_INFO si;
  GetSystemInfo(&si);
  return si.dwPageSize;
#else
  long size = FMT_POSIX_CALL(sysconf(_SC_PAGESIZE));
  if (size < 0)
    FMT_THROW(SystemError(errno, "cannot get memory page size"));
  return size;
#endif
}